

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O1

uint32 tied_state(dtree_node_t *node,acmod_id_t b,acmod_id_t l,acmod_id_t r,word_posn_t wp,
                 pset_t *pset)

{
  int iVar1;
  uint32 uVar2;
  dtree_node_str *node_00;
  uint32 dfeat [4];
  acmod_id_t local_48;
  acmod_id_t local_44;
  acmod_id_t local_40;
  word_posn_t local_3c;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    uVar2 = node->clust;
  }
  else {
    local_48 = l;
    local_44 = b;
    local_40 = r;
    local_3c = wp;
    iVar1 = eval_comp_quest((comp_quest_t *)node->q,&local_48,4);
    if (iVar1 == 0) {
      node_00 = node->n;
    }
    else {
      node_00 = node->y;
    }
    uVar2 = tied_state(node_00,b,l,r,wp,pset);
  }
  return uVar2;
}

Assistant:

uint32
tied_state(dtree_node_t *node,
	   acmod_id_t b,
	   acmod_id_t l,
	   acmod_id_t r,
	   word_posn_t wp,
	   pset_t *pset)
{
    uint32 dfeat[4];

    dfeat[0] = (uint32)l;
    dfeat[1] = (uint32)b;
    dfeat[2] = (uint32)r;
    dfeat[3] = (uint32)wp;

    if (IS_LEAF(node)) {
	/* Got to a state cluster.  Return the id */
	return node->clust;
    }
    else {
#ifdef HORRIBLY_VERBOSE
	print_comp_quest(stderr, pset, (comp_quest_t *)node->q);
#endif
	if (eval_comp_quest((comp_quest_t *)node->q, dfeat, 4)) {
#ifdef HORRIBLY_VERBOSE
	    fprintf(stderr, " -> y\n");
#endif
	    return tied_state(node->y, b, l, r, wp, pset);
	}
	else {
#ifdef HORRIBLY_VERBOSE
	    fprintf(stderr, " -> n\n");
#endif
	    return tied_state(node->n, b, l, r, wp, pset);
	}
    }
}